

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

bool cmState::StringToCacheEntryType(char *s,CacheEntryType *type)

{
  char *__s2;
  int iVar1;
  CacheEntryType CVar2;
  char **ppcVar3;
  
  CVar2 = BOOL;
  ppcVar3 = cmCacheEntryTypes;
  do {
    __s2 = *ppcVar3;
    if (__s2 == (char *)0x0) {
LAB_001bfc57:
      return __s2 != (char *)0x0;
    }
    iVar1 = strcmp(s,__s2);
    if (iVar1 == 0) {
      *type = CVar2;
      goto LAB_001bfc57;
    }
    CVar2 = CVar2 + PATH;
    ppcVar3 = ppcVar3 + 1;
  } while( true );
}

Assistant:

bool cmState::StringToCacheEntryType(const char* s,
                                     cmStateEnums::CacheEntryType& type)
{
  int i = 0;
  while (cmCacheEntryTypes[i]) {
    if (strcmp(s, cmCacheEntryTypes[i]) == 0) {
      type = static_cast<cmStateEnums::CacheEntryType>(i);
      return true;
    }
    ++i;
  }
  return false;
}